

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall dtc::fdt::property::parse_reference(property *this,text_input_buffer *input)

{
  char cVar1;
  property_value v;
  string local_c0;
  string local_a0;
  undefined1 local_80 [40];
  size_type local_58;
  value_type local_28;
  
  cVar1 = text_input_buffer::operator*(input);
  if (cVar1 == '&') {
    text_input_buffer::operator++(input);
    text_input_buffer::next_token(input);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    property_value::property_value((property_value *)local_80,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    text_input_buffer::parse_node_name_abi_cxx11_(&local_a0,input);
    std::__cxx11::string::operator=((string *)(local_80 + 0x20),(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (local_58 == 0) {
      text_input_buffer::parse_error(input,"Expected node name");
      this->valid = false;
    }
    else {
      local_28 = CROSS_REFERENCE;
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&this->values,(value_type *)local_80);
    }
    property_value::~property_value((property_value *)local_80);
    return;
  }
  __assert_fail("*input == \'&\'",
                "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",0x1a0
                ,"void dtc::fdt::property::parse_reference(text_input_buffer &)");
}

Assistant:

void
property::parse_reference(text_input_buffer &input)
{
	assert(*input == '&');
	++input;
	input.next_token();
	property_value v;
	v.string_data = input.parse_node_name();
	if (v.string_data.empty())
	{
		input.parse_error("Expected node name");
		valid = false;
		return;
	}
	v.type = property_value::CROSS_REFERENCE;
	values.push_back(v);
}